

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iter.c
# Opt level: O3

int tnt_iter_array_next(tnt_iter *i)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  byte *pbVar4;
  byte *pbVar5;
  int64_t k;
  char **data;
  long lVar6;
  
  uVar3 = (i->data).array.cur_index + 1;
  (i->data).array.cur_index = uVar3;
  if ((i->data).array.elem_count <= uVar3) {
    i->status = TNT_ITER_FAIL;
    return 0;
  }
  pbVar5 = *(byte **)((long)&i->data + (ulong)(uVar3 != 0) * 0x10 + 8);
  (i->data).array.elem = (char *)pbVar5;
  data = &(i->data).array.elem_end;
  k = 1;
  do {
    bVar1 = *pbVar5;
    pbVar4 = pbVar5 + 1;
    *data = (char *)pbVar4;
    lVar6 = (long)""[bVar1];
    if (lVar6 < 0) {
      if (bVar1 == 0xd9) {
        pbVar4 = pbVar5 + (ulong)pbVar5[1] + 2;
        goto LAB_00107f9a;
      }
      if ((byte)""[bVar1] < 0xe1) {
        *data = (char *)pbVar5;
        mp_next_slowpath(data,k);
        return 1;
      }
      k = k - lVar6;
    }
    else {
      pbVar4 = pbVar4 + lVar6;
LAB_00107f9a:
      *data = (char *)pbVar4;
    }
    bVar2 = k < 2;
    pbVar5 = pbVar4;
    k = k + -1;
    if (bVar2) {
      return 1;
    }
  } while( true );
}

Assistant:

static int tnt_iter_array_next(struct tnt_iter *i) {
	struct tnt_iter_array *itr = TNT_IARRAY(i);
	itr->cur_index++;
	if ((uint32_t)itr->cur_index >= itr->elem_count) {
		i->status = TNT_ITER_FAIL;
		return 0;
	}
	if (itr->cur_index == 0)
		itr->elem = itr->first_elem;
	else
		itr->elem = itr->elem_end;
	itr->elem_end = itr->elem;
	mp_next(&itr->elem_end);
	return 1;
}